

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void __thiscall CCoinsViewCache::Uncache(CCoinsViewCache *this,COutPoint *hash)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  __node_type *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar4;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> __position;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_cur = in_RDI;
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::find((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
          *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),(key_type *)in_RDI);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::end((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = std::__detail::operator==
                    (in_stack_ffffffffffffffc8,
                     (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar4 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)in_RDI)
    ;
    bVar2 = CCoinsCacheEntry::IsDirty((CCoinsCacheEntry *)in_RDI);
    bVar4 = 0;
    if (!bVar2) {
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_RDI);
      bVar2 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_RDI);
      bVar4 = bVar2 ^ 0xff;
    }
  }
  if ((bVar4 & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)in_RDI)
    ;
    sVar3 = Coin::DynamicMemoryUsage((Coin *)in_RDI);
    *(size_t *)
     ((long)&in_RDI[3].super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
             super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>._M_storage.
             _M_storage + 0x50) =
         *(long *)((long)&in_RDI[3].
                          super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          .
                          super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>
                          ._M_storage._M_storage + 0x50) - sVar3;
    std::
    unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
    ::erase((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
             *)CONCAT17(bVar4,in_stack_ffffffffffffffc0),(iterator)__position._M_cur);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCoinsViewCache::Uncache(const COutPoint& hash)
{
    CCoinsMap::iterator it = cacheCoins.find(hash);
    if (it != cacheCoins.end() && !it->second.IsDirty() && !it->second.IsFresh()) {
        cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
        TRACE5(utxocache, uncache,
               hash.hash.data(),
               (uint32_t)hash.n,
               (uint32_t)it->second.coin.nHeight,
               (int64_t)it->second.coin.out.nValue,
               (bool)it->second.coin.IsCoinBase());
        cacheCoins.erase(it);
    }
}